

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O3

void testSharedFrameBuffer(string *tempDir)

{
  pointer pcVar1;
  void *pvVar2;
  char cVar3;
  ushort uVar4;
  long *plVar5;
  int iVar6;
  float fVar7;
  ulong uVar8;
  ulong uVar9;
  RgbaChannels in_R8D;
  Compression in_R9D;
  long lVar10;
  uint uVar11;
  long lVar12;
  Array2D<Imf_3_2::Rgba> *p1_00;
  float fVar13;
  double dVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Array2D<Imf_3_2::Rgba> p1;
  long *local_b0 [2];
  long local_a0 [2];
  int local_90;
  int local_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  long local_70;
  void *local_68;
  ulong local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing reading from and writing to files using\nmultiple threads and a shared framebuffer"
             ,0x59);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  cVar3 = IlmThread_3_2::supportsThreads();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Threading not supported!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  else {
    local_78 = 0x9f;
    local_70 = 0x55b;
    local_68 = operator_new__(0x1a9c28);
    lVar12 = 0;
    iVar6 = 0;
    uVar8 = 0;
    do {
      local_50 = (double)(int)uVar8 * 0.2;
      local_58 = (double)(int)uVar8 * 0.3;
      local_8c = iVar6 + (int)((uVar8 & 0xffffffff) / 100) * -10000;
      uVar9 = 0;
      local_90 = iVar6;
      local_60 = uVar8;
      do {
        pvVar2 = local_68;
        lVar10 = local_70;
        dVar14 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar13 = (float)((1.0 - dVar14) * -0.009999999776482582 + dVar14 * -0.009999999776482582 +
                        (double)(local_8c + (int)((uVar9 & 0xffffffff) / 100) * -100 + (int)uVar9));
        fVar7 = ABS(fVar13);
        uVar4 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
        if ((uint)fVar7 < 0x38800000) {
          if ((0x33000000 < (uint)fVar7) &&
             (uVar11 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
             uVar4 = uVar4 | (ushort)(uVar11 >> (0x7eU - cVar3 & 0x1f)),
             0x80000000 < uVar11 << (cVar3 + 0xa2U & 0x1f))) {
            uVar4 = uVar4 + 1;
          }
        }
        else if ((uint)fVar7 < 0x7f800000) {
          if ((uint)fVar7 < 0x477ff000) {
            uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd)
                    | uVar4;
          }
          else {
            uVar4 = uVar4 | 0x7c00;
          }
        }
        else {
          uVar4 = uVar4 | 0x7c00;
          if (fVar7 != INFINITY) {
            uVar11 = (uint)fVar7 >> 0xd & 0x3ff;
            uVar4 = uVar4 | (ushort)uVar11 | (ushort)(uVar11 == 0);
          }
        }
        lVar10 = lVar10 * lVar12;
        dVar14 = (double)(int)uVar9;
        *(ushort *)((long)pvVar2 + uVar9 * 8 + lVar10) = uVar4;
        local_88._0_8_ = dVar14;
        dVar14 = sin(dVar14 * 0.1 + local_50);
        local_48._8_4_ = extraout_XMM0_Dc;
        local_48._0_8_ = dVar14;
        local_48._12_4_ = extraout_XMM0_Dd;
        dVar14 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar13 = (float)((1.0 - dVar14) * -0.009999999776482582 + dVar14 * -0.009999999776482582 +
                        (double)local_48._0_8_ * 0.5 + 0.5);
        fVar7 = ABS(fVar13);
        uVar4 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
        if ((uint)fVar7 < 0x38800000) {
          if ((0x33000000 < (uint)fVar7) &&
             (uVar11 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
             uVar4 = uVar4 | (ushort)(uVar11 >> (0x7eU - cVar3 & 0x1f)),
             0x80000000 < uVar11 << (cVar3 + 0xa2U & 0x1f))) {
            uVar4 = uVar4 + 1;
          }
        }
        else if ((uint)fVar7 < 0x7f800000) {
          if ((uint)fVar7 < 0x477ff000) {
            uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd)
                    | uVar4;
          }
          else {
            uVar4 = uVar4 | 0x7c00;
          }
        }
        else {
          uVar4 = uVar4 | 0x7c00;
          if (fVar7 != INFINITY) {
            uVar11 = (uint)fVar7 >> 0xd & 0x3ff;
            uVar4 = uVar4 | (ushort)uVar11 | (ushort)(uVar11 == 0);
          }
        }
        *(ushort *)((long)pvVar2 + uVar9 * 8 + lVar10 + 2) = uVar4;
        dVar14 = sin((double)local_88._0_8_ * 0.1 + local_58);
        local_88._8_4_ = extraout_XMM0_Dc_00;
        local_88._0_8_ = dVar14;
        local_88._12_4_ = extraout_XMM0_Dd_00;
        dVar14 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar13 = (float)((1.0 - dVar14) * -0.009999999776482582 + dVar14 * -0.009999999776482582 +
                        (double)local_88._0_8_ * 0.5 + 0.5);
        fVar7 = ABS(fVar13);
        uVar4 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
        if ((uint)fVar7 < 0x38800000) {
          if ((0x33000000 < (uint)fVar7) &&
             (uVar11 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
             uVar4 = uVar4 | (ushort)(uVar11 >> (0x7eU - cVar3 & 0x1f)),
             0x80000000 < uVar11 << (cVar3 + 0xa2U & 0x1f))) {
            uVar4 = uVar4 + 1;
          }
        }
        else if ((uint)fVar7 < 0x7f800000) {
          if ((uint)fVar7 < 0x477ff000) {
            uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd)
                    | uVar4;
          }
          else {
            uVar4 = uVar4 | 0x7c00;
          }
        }
        else {
          uVar4 = uVar4 | 0x7c00;
          if (fVar7 != INFINITY) {
            uVar11 = (uint)fVar7 >> 0xd & 0x3ff;
            uVar4 = uVar4 | (ushort)uVar11 | (ushort)(uVar11 == 0);
          }
        }
        *(ushort *)((long)pvVar2 + uVar9 * 8 + lVar10 + 4) = uVar4;
        dVar14 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar13 = (float)((1.0 - dVar14) * 0.0 + dVar14);
        fVar7 = ABS(fVar13);
        uVar4 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
        if ((uint)fVar7 < 0x38800000) {
          if ((0x33000000 < (uint)fVar7) &&
             (uVar11 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
             uVar4 = uVar4 | (ushort)(uVar11 >> (0x7eU - cVar3 & 0x1f)),
             0x80000000 < uVar11 << (cVar3 + 0xa2U & 0x1f))) {
            uVar4 = uVar4 + 1;
          }
        }
        else if ((uint)fVar7 < 0x7f800000) {
          if ((uint)fVar7 < 0x477ff000) {
            uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd)
                    | uVar4;
          }
          else {
            uVar4 = uVar4 | 0x7c00;
          }
        }
        else {
          uVar4 = uVar4 | 0x7c00;
          if (fVar7 != INFINITY) {
            uVar11 = (uint)fVar7 >> 0xd & 0x3ff;
            uVar4 = uVar4 | (ushort)uVar11 | (ushort)(uVar11 == 0);
          }
        }
        *(ushort *)((long)pvVar2 + uVar9 * 8 + lVar10 + 6) = uVar4;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x55b);
      uVar8 = local_60 + 1;
      iVar6 = local_90 + 100;
      lVar12 = lVar12 + 8;
    } while (uVar8 != 0x9f);
    uVar8 = 0;
    do {
      local_88._0_8_ = uVar8;
      Imf_3_2::setGlobalThreadCount((int)uVar8 * 3 & 7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"number of threads: ",0x13);
      iVar6 = Imf_3_2::globalThreadCount();
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      p1_00 = (Array2D<Imf_3_2::Rgba> *)0x0;
      do {
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        iVar6 = (int)&local_78;
        anon_unknown.dwarf_2dfa33::writeReadRGBA((char *)local_b0[0],iVar6,0xf,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2dfa33::writeReadRGBA((char *)local_b0[0],iVar6,7,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2dfa33::writeReadRGBA((char *)local_b0[0],iVar6,8,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2dfa33::writeReadRGBA((char *)local_b0[0],iVar6,5,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        uVar11 = (int)p1_00 + 1;
        p1_00 = (Array2D<Imf_3_2::Rgba> *)(ulong)uVar11;
      } while (uVar11 != 10);
      uVar11 = local_88._0_4_ + 1;
      uVar8 = (ulong)uVar11;
    } while (uVar11 != 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
  }
  return;
}

Assistant:

void
testSharedFrameBuffer (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading from and writing to files using\n"
                "multiple threads and a shared framebuffer"
             << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

#if ILMTHREAD_THREADING_ENABLED
        const int W = 1371;
        const int H = 159;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGBA,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGB,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_A,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    RgbaChannels (WRITE_R | WRITE_B),
                    Compression (comp));
            }
        }
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}